

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int get_active_best_quality(AV1_COMP *cpi,int active_worst_quality,int cq_level,int gf_index)

{
  byte bVar1;
  aom_bit_depth_t bit_depth;
  aom_rc_mode aVar2;
  AV1_PRIMARY *pAVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined *puVar8;
  
  bit_depth = ((cpi->common).seq_params)->bit_depth;
  pAVar3 = cpi->ppi;
  if (bit_depth - AOM_BITS_8 < 5) {
    puVar8 = (&PTR_inter_minq_8_005dda28)[bit_depth - AOM_BITS_8];
  }
  else {
    puVar8 = (undefined *)0x0;
  }
  bVar1 = (pAVar3->gf_group).update_type[gf_index];
  bVar4 = (bVar1 & 0xfe) != 2 && bVar1 != 6;
  if (((cpi->common).tiles.large_scale != 0) &&
     (bVar4 = false, (cpi->refresh_frame).golden_frame == false)) {
    bVar4 = (cpi->refresh_frame).alt_ref_frame == false && bVar1 != 6;
  }
  aVar2 = (cpi->oxcf).rc_cfg.mode;
  if (bVar4 || (cpi->rc).is_src_frame_alt_ref != 0) {
    if (aVar2 != AOM_Q) {
      iVar5 = *(int *)(puVar8 + (long)active_worst_quality * 4);
      if (cq_level < iVar5) {
        cq_level = iVar5;
      }
      if (aVar2 != AOM_CQ) {
        cq_level = iVar5;
      }
    }
  }
  else {
    iVar5 = active_worst_quality;
    if ((1 < (cpi->rc).frames_since_key) &&
       (iVar5 = (pAVar3->p_rc).avg_frame_qindex[1], active_worst_quality <= iVar5)) {
      iVar5 = active_worst_quality;
    }
    if (cq_level < iVar5) {
      cq_level = iVar5;
    }
    if (aVar2 != AOM_CQ) {
      cq_level = iVar5;
    }
    iVar5 = get_gf_active_quality
                      ((PRIMARY_RATE_CONTROL *)(ulong)(uint)(pAVar3->p_rc).gfu_boost,cq_level,
                       bit_depth);
    if (aVar2 == AOM_CQ) {
      iVar6 = iVar5 * 0xf + 0xf;
      if (-1 < iVar5 * 0xf) {
        iVar6 = iVar5 * 0xf;
      }
      iVar5 = iVar6 >> 4;
    }
    cq_level = *(int *)((&PTR_arfgf_high_motion_minq_10_005dda10)[(int)bit_depth] +
                       (long)cq_level * 4) -
               (int)((float)(*(int *)((&PTR_arfgf_high_motion_minq_10_005dda10)[(int)bit_depth] +
                                     (long)cq_level * 4) - iVar5) * (pAVar3->p_rc).arf_boost_factor)
    ;
    if (bVar1 == 6) {
      if ((aVar2 & ~AOM_CBR) == AOM_CQ) {
        cq_level = (pAVar3->p_rc).arf_q;
      }
      iVar5 = (pAVar3->gf_group).layer_depth[gf_index];
      if (1 < iVar5) {
        uVar7 = iVar5 + 1;
        do {
          cq_level = (cq_level + active_worst_quality + 1) / 2;
          uVar7 = uVar7 - 1;
        } while (2 < uVar7);
      }
    }
  }
  return cq_level;
}

Assistant:

static int get_active_best_quality(const AV1_COMP *const cpi,
                                   const int active_worst_quality,
                                   const int cq_level, const int gf_index) {
  const AV1_COMMON *const cm = &cpi->common;
  const int bit_depth = cm->seq_params->bit_depth;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const enum aom_rc_mode rc_mode = oxcf->rc_cfg.mode;
  int *inter_minq;
  ASSIGN_MINQ_TABLE(bit_depth, inter_minq);
  int active_best_quality = 0;
  const int is_intrl_arf_boost =
      gf_group->update_type[gf_index] == INTNL_ARF_UPDATE;
  int is_leaf_frame =
      !(gf_group->update_type[gf_index] == ARF_UPDATE ||
        gf_group->update_type[gf_index] == GF_UPDATE || is_intrl_arf_boost);

  // TODO(jingning): Consider to rework this hack that covers issues incurred
  // in lightfield setting.
  if (cm->tiles.large_scale) {
    is_leaf_frame = !(refresh_frame->golden_frame ||
                      refresh_frame->alt_ref_frame || is_intrl_arf_boost);
  }
  const int is_overlay_frame = rc->is_src_frame_alt_ref;

  if (is_leaf_frame || is_overlay_frame) {
    if (rc_mode == AOM_Q) return cq_level;

    active_best_quality = inter_minq[active_worst_quality];
    // For the constrained quality mode we don't want
    // q to fall below the cq level.
    if ((rc_mode == AOM_CQ) && (active_best_quality < cq_level)) {
      active_best_quality = cq_level;
    }
    return active_best_quality;
  }

  // Determine active_best_quality for frames that are not leaf or overlay.
  int q = active_worst_quality;
  // Use the lower of active_worst_quality and recent
  // average Q as basis for GF/ARF best Q limit unless last frame was
  // a key frame.
  if (rc->frames_since_key > 1 &&
      p_rc->avg_frame_qindex[INTER_FRAME] < active_worst_quality) {
    q = p_rc->avg_frame_qindex[INTER_FRAME];
  }
  if (rc_mode == AOM_CQ && q < cq_level) q = cq_level;
  active_best_quality = get_gf_active_quality(p_rc, q, bit_depth);
  // Constrained quality use slightly lower active best.
  if (rc_mode == AOM_CQ) active_best_quality = active_best_quality * 15 / 16;
  const int min_boost = get_gf_high_motion_quality(q, bit_depth);
  const int boost = min_boost - active_best_quality;
  active_best_quality = min_boost - (int)(boost * p_rc->arf_boost_factor);
  if (!is_intrl_arf_boost) return active_best_quality;

  if (rc_mode == AOM_Q || rc_mode == AOM_CQ) active_best_quality = p_rc->arf_q;
  int this_height = gf_group_pyramid_level(gf_group, gf_index);
  while (this_height > 1) {
    active_best_quality = (active_best_quality + active_worst_quality + 1) / 2;
    --this_height;
  }
  return active_best_quality;
}